

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testTrace_traceLoggingLevel_shouldPrintMessage
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  stringstream ss;
  SimpleLogger local_1a0 [8];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  juzzlin::SimpleLogger::setStream(Trace,local_188);
  juzzlin::SimpleLogger::setLoggingLevel(Trace);
  juzzlin::SimpleLogger::SimpleLogger(local_1a0);
  poVar1 = (ostream *)juzzlin::SimpleLogger::trace_abi_cxx11_();
  std::operator<<(poVar1,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger(local_1a0);
  assertMessage((stringstream *)local_198,message,timestampSeparator);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void testTrace_traceLoggingLevel_shouldPrintMessage(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Trace, ss);
    L::setLoggingLevel(L::Level::Trace);
    L().trace() << message;
    assertMessage(ss, message, timestampSeparator);
}